

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O1

sat_solver *
Sbd_ManSatSolver(sat_solver *pSat,Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,int fQbf)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  lit *begin;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  int iLit;
  int pLits [2];
  int in_stack_ffffffffffffff68;
  lit local_74;
  Gia_Man_t *local_70;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  int local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_74 = 1;
  if ((-1 < Pivot) && (Pivot < vObj2Var->nSize)) {
    local_48 = (ulong)(uint)vWinObjs->nSize;
    local_40 = (ulong)(uint)vTfo->nSize;
    local_38 = (ulong)(uint)vObj2Var->pArray[(uint)Pivot];
    local_50 = (ulong)(uint)vRoots->nSize;
    local_60 = vMirrors;
    if (pSat == (sat_solver *)0x0) {
      pSat = sat_solver_new();
    }
    else {
      sat_solver_restart(pSat);
    }
    sat_solver_setnvars(pSat,vRoots->nSize + vWinObjs->nSize + vTfo->nSize + 100);
    sat_solver_addclause(pSat,&local_74,(lit *)&local_70);
    local_70 = p;
    local_68 = vWinObjs;
    if (1 < vWinObjs->nSize) {
      lVar19 = 1;
      do {
        iVar12 = vWinObjs->pArray[lVar19];
        lVar9 = (long)iVar12;
        if ((lVar9 < 0) || (p->nObjs <= iVar12)) goto LAB_00546776;
        uVar20 = *(ulong *)(p->pObjs + lVar9);
        uVar7 = (uint)uVar20;
        if ((~uVar7 & 0x9fffffff) != 0) {
          if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                          ,0x4e,
                          "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar10 = local_60->nSize;
          if (iVar10 <= iVar12) goto LAB_00546757;
          piVar6 = local_60->pArray;
          if (-1 < piVar6[lVar9]) {
            __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                          ,0x4f,
                          "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar14 = vObj2Var->nSize;
          if (iVar14 <= iVar12) goto LAB_00546757;
          uVar21 = iVar12 - (uVar7 & 0x1fffffff);
          if (((int)uVar21 < 0) || (iVar10 <= (int)uVar21)) goto LAB_00546757;
          uVar13 = (uint)(uVar20 >> 0x20);
          uVar15 = uVar13 & 0x1fffffff;
          uVar16 = iVar12 - uVar15;
          if (((int)uVar16 < 0) || (iVar10 <= (int)uVar16)) goto LAB_00546757;
          uVar17 = piVar6[uVar21];
          uVar1 = piVar6[uVar16];
          uVar2 = uVar17 >> 1;
          if ((int)uVar17 < 0) {
            uVar2 = uVar21;
          }
          uVar21 = uVar1 >> 1;
          if ((int)uVar1 < 0) {
            uVar21 = uVar16;
          }
          if (((((int)uVar2 < 0) || (iVar14 <= (int)uVar2)) || ((int)uVar21 < 0)) ||
             (iVar14 <= (int)uVar21)) goto LAB_00546757;
          piVar6 = vObj2Var->pArray;
          uVar16 = ~uVar17 >> 0x1f & uVar17 ^ (uint)(uVar20 >> 0x1d) & 1;
          uVar13 = ~uVar1 >> 0x1f & uVar1 ^ uVar13 >> 0x1d & 1;
          if ((((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) ||
             (uVar15 <= (uVar7 & 0x1fffffff))) {
            sat_solver_add_and(pSat,piVar6[lVar9],piVar6[uVar2],piVar6[uVar21],uVar16,uVar13,
                               in_stack_ffffffffffffff68);
            p = local_70;
            vWinObjs = local_68;
          }
          else {
            sat_solver_add_xor(pSat,piVar6[lVar9],piVar6[uVar2],piVar6[uVar21],uVar13 ^ uVar16);
            p = local_70;
            vWinObjs = local_68;
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < vWinObjs->nSize);
    }
    uVar7 = (int)local_48 - (int)local_40;
    iVar10 = (int)local_40 + (int)local_48 + (int)local_50;
    iVar12 = vWinObjs->nSize;
    if ((int)uVar7 < iVar12) {
      uVar20 = (ulong)uVar7;
      do {
        if ((int)uVar7 < 0) goto LAB_00546757;
        iVar12 = vWinObjs->pArray[uVar20];
        lVar19 = (long)iVar12;
        if ((lVar19 < 0) || (p->nObjs <= iVar12)) {
LAB_00546776:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar3 = *(ulong *)(p->pObjs + lVar19);
        uVar21 = (uint)uVar3;
        if (((int)uVar21 < 0) || ((uVar21 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                        ,0x62,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        iVar14 = local_60->nSize;
        if (iVar14 <= iVar12) goto LAB_00546757;
        piVar6 = local_60->pArray;
        if (-1 < piVar6[lVar19]) {
          __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                        ,99,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        iVar11 = vObj2Var->nSize;
        if (iVar11 <= iVar12) goto LAB_00546757;
        uVar13 = iVar12 - (uVar21 & 0x1fffffff);
        if (((int)uVar13 < 0) || (iVar14 <= (int)uVar13)) goto LAB_00546757;
        uVar15 = (uint)(uVar3 >> 0x20);
        uVar16 = uVar15 & 0x1fffffff;
        uVar17 = iVar12 - uVar16;
        if (((int)uVar17 < 0) || (iVar14 <= (int)uVar17)) goto LAB_00546757;
        uVar1 = piVar6[uVar13];
        uVar2 = piVar6[uVar17];
        uVar4 = uVar1 >> 1;
        if ((int)uVar1 < 0) {
          uVar4 = uVar13;
        }
        uVar13 = uVar2 >> 1;
        if ((int)uVar2 < 0) {
          uVar13 = uVar17;
        }
        if (((((int)uVar4 < 0) || (iVar11 <= (int)uVar4)) || ((int)uVar13 < 0)) ||
           (iVar11 <= (int)uVar13)) goto LAB_00546757;
        piVar6 = vObj2Var->pArray;
        iVar12 = vTfo->nSize;
        iVar11 = piVar6[lVar19] + iVar12;
        iVar14 = iVar12;
        if (piVar6[uVar4] < (int)uVar7) {
          iVar14 = 0;
        }
        iVar14 = iVar14 + piVar6[uVar4];
        if (piVar6[uVar13] < (int)uVar7) {
          iVar12 = 0;
        }
        iVar12 = iVar12 + piVar6[uVar13];
        iVar18 = (int)local_38;
        iVar8 = iVar14;
        if (iVar14 == iVar18) {
          iVar8 = iVar10;
        }
        iVar5 = iVar12;
        if (iVar12 == iVar18) {
          iVar5 = iVar10;
        }
        bVar22 = fQbf == 0;
        if (bVar22) {
          iVar5 = iVar12;
          iVar8 = iVar14;
        }
        uVar13 = ~uVar1 >> 0x1f & uVar1 ^ (uint)(uVar3 >> 0x1d) & 1 ^
                 (uint)(iVar8 == iVar18 && bVar22);
        uVar15 = ~uVar2 >> 0x1f & uVar2 ^ uVar15 >> 0x1d & 1 ^ (uint)(iVar5 == iVar18 && bVar22);
        if ((((int)uVar21 < 0) || ((uVar21 & 0x1fffffff) == 0x1fffffff)) ||
           (uVar16 <= (uVar21 & 0x1fffffff))) {
          sat_solver_add_and(pSat,iVar11,iVar8,iVar5,uVar13,uVar15,in_stack_ffffffffffffff68);
        }
        else {
          sat_solver_add_xor(pSat,iVar11,iVar8,iVar5,uVar15 ^ uVar13);
        }
        uVar20 = uVar20 + 1;
        iVar12 = local_68->nSize;
        p = local_70;
        vWinObjs = local_68;
      } while ((int)uVar20 < iVar12);
    }
    uVar7 = vRoots->nSize;
    if ((int)uVar7 < 1) {
      if (fQbf != 0) {
        iVar12 = (int)local_38;
        if (iVar12 < 0) {
LAB_00546795:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar8 = (int)local_50;
        iVar14 = (int)local_48;
        iVar11 = (int)local_40;
        iVar18 = 0;
        do {
          local_58 = iVar12 * 2 + iVar18;
          if (iVar10 < 0) goto LAB_00546795;
          local_54 = iVar8 * 2 + iVar14 * 2 + iVar11 * 2 + iVar18;
          iVar5 = sat_solver_addclause(pSat,&local_58,(lit *)&local_50);
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                          ,0x97,
                          "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 == 1);
      }
    }
    else {
      iVar12 = iVar12 + vTfo->nSize;
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar20 = 0x10;
      if (0x10 < uVar7) {
        uVar20 = (ulong)uVar7;
      }
      p_00->nSize = 0;
      p_00->nCap = (int)uVar20;
      piVar6 = (int *)malloc(uVar20 << 2);
      p_00->pArray = piVar6;
      if (0 < vRoots->nSize) {
        iVar10 = iVar12 * 2;
        lVar19 = 0;
        do {
          iVar14 = vRoots->pArray[lVar19];
          lVar9 = (long)iVar14;
          if ((lVar9 < 0) || (local_60->nSize <= iVar14)) goto LAB_00546757;
          if (-1 < local_60->pArray[lVar9]) {
            __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                          ,0x80,
                          "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          if (vObj2Var->nSize <= iVar14) goto LAB_00546757;
          if (iVar12 < 0) goto LAB_00546795;
          iVar14 = vObj2Var->pArray[lVar9];
          Vec_IntPush(p_00,iVar10);
          sat_solver_add_xor(pSat,iVar14,vTfo->nSize + iVar14,iVar12 + (int)lVar19,0);
          lVar19 = lVar19 + 1;
          iVar10 = iVar10 + 2;
        } while (lVar19 < vRoots->nSize);
        iVar12 = iVar12 + (int)lVar19;
      }
      begin = p_00->pArray;
      iVar10 = sat_solver_addclause(pSat,begin,begin + p_00->nSize);
      if (begin != (lit *)0x0) {
        free(begin);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      if (iVar10 == 0) {
        sat_solver_delete(pSat);
      }
      else {
        iVar14 = sat_solver_nvars(pSat);
        if (iVar14 != iVar12 + 100) {
          __assert_fail("sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                        ,0x8d,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
      }
      if (iVar10 == 0) {
        return (sat_solver *)0x0;
      }
    }
    iVar12 = sat_solver_simplify(pSat);
    if (iVar12 == 0) {
      sat_solver_delete(pSat);
      return (sat_solver *)0x0;
    }
    return pSat;
  }
LAB_00546757:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Constructs SAT solver for the window.]

  Description [The window for the pivot node (Pivot) is represented as
  a DFS ordered array of objects (vWinObjs) whose indexed in the array
  (which will be used as SAT variables) are given in array vObj2Var.
  The TFO nodes are listed as the last ones in vWinObjs. The root nodes
  are labeled with Abc_LitIsCompl() in vTfo and also given in vRoots.
  If fQbf is 1, returns the instance meant for QBF solving. It is using
  the last variable (LastVar) as the placeholder for the second copy
  of the pivot node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, 
                               int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                               Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf )
{
    Gia_Obj_t * pObj;
    int i, iLit = 1, iObj, Fan0, Fan1, Lit0m, Lit1m, Node, fCompl0, fCompl1, RetValue;
    int TfoStart = Vec_IntSize(vWinObjs) - Vec_IntSize(vTfo);
    int PivotVar = Vec_IntEntry(vObj2Var, Pivot);
    int LastVar = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    //Vec_IntPrint( vWinObjs );
    //Vec_IntPrint( vTfo );
    //Vec_IntPrint( vRoots );
    // create SAT solver
    if ( pSat == NULL )
        pSat = sat_solver_new();
    else
        sat_solver_restart( pSat );
    sat_solver_setnvars( pSat, Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots) + SBD_FVAR_MAX );
    // create constant 0 clause
    sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    // add clauses for all nodes
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, 1 )
    {
        pObj = Gia_ManObj( p, iObj );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, TfoStart )
    {
        pObj = Gia_ManObj( p, iObj );
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj ) + Vec_IntSize(vTfo);
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        Fan0 = Fan0 < TfoStart ? Fan0 : Fan0 + Vec_IntSize(vTfo);
        Fan1 = Fan1 < TfoStart ? Fan1 : Fan1 + Vec_IntSize(vTfo);
        if ( fQbf )
        {
            Fan0 = Fan0 == PivotVar ? LastVar : Fan0;
            Fan1 = Fan1 == PivotVar ? LastVar : Fan1;
        }
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (!fQbf && Fan0 == PivotVar) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (!fQbf && Fan1 == PivotVar) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    if ( Vec_IntSize(vRoots) > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo);
        Vec_Int_t * vFaninVars = Vec_IntAlloc( Vec_IntSize(vRoots) );
        Vec_IntForEachEntry( vRoots, iObj, i )
        {
            assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
            Node = Vec_IntEntry( vObj2Var, iObj );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars, 0) );
            sat_solver_add_xor( pSat, Node, Node + Vec_IntSize(vTfo), nVars++, 0 );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vFaninVars), Vec_IntLimit(vFaninVars) );
        Vec_IntFree( vFaninVars );
        if ( RetValue == 0 )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
        assert( sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX );
    }
    else if ( fQbf )
    {
        int n, pLits[2];
        for ( n = 0; n < 2; n++ )
        {
            pLits[0] = Abc_Var2Lit( PivotVar, n );
            pLits[1] = Abc_Var2Lit( LastVar, n );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( RetValue == 0 )
    {
        sat_solver_delete( pSat );
        return NULL;    
    }
    return pSat;
}